

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O0

bool __thiscall VWReaderHandler<false>::EndArray(VWReaderHandler<false> *this,SizeType count)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  uint in_ESI;
  Context<false> *in_RDI;
  
  iVar2 = (*in_RDI->current_state->_vptr_BaseState[9])(in_RDI->current_state,in_RDI,(ulong)in_ESI);
  bVar1 = Context<false>::TransitionState(in_RDI,(BaseState<false> *)CONCAT44(extraout_var,iVar2));
  return bVar1;
}

Assistant:

bool EndArray(SizeType count) { return ctx.TransitionState(ctx.current_state->EndArray(ctx, count)); }